

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exclusive_scan.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  int iVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  pointer piVar7;
  ostream *poVar8;
  runtime_error *this;
  undefined8 uVar9;
  size_type sVar10;
  ulong uVar11;
  pointer piVar12;
  Executor *this_00;
  size_type __n;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  in_place_type_t<tf::Node::Subflow> local_2ca;
  DefaultTaskParams local_2c9;
  vector<int,_std::allocator<int>_> elements;
  anon_class_32_5_19846b26 local_2a8;
  vector<int,_std::allocator<int>_> scan_par;
  vector<int,_std::allocator<int>_> scan_seq;
  void *local_250;
  anon_class_8_1_69701ed9 local_248;
  int local_23c;
  __shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2> local_238;
  Taskflow taskflow;
  Executor executor;
  long lVar15;
  
  if (argc != 3) {
    std::operator<<((ostream *)&std::cerr,"usage: ./exclusive_scan num_workers num_elements\n");
    exit(1);
  }
  iVar5 = atoi(argv[1]);
  iVar6 = atoi(argv[2]);
  local_238._M_ptr = (element_type *)0x0;
  local_238._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(long)iVar5,(shared_ptr<tf::WorkerInterface> *)&local_238);
  if (local_238._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_refcount._M_pi);
  }
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  taskflow._mutex.super___mutex_base._M_mutex._0_16_ = (undefined1  [16])0x0;
  taskflow._mutex.super___mutex_base._M_mutex._16_16_ = (undefined1  [16])0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow._name._M_string_length = 0;
  taskflow._name.field_2._M_local_buf[0] = '\0';
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  __n = (size_type)iVar6;
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  std::vector<int,_std::allocator<int>_>::vector(&elements,__n,(allocator_type *)&local_2a8);
  std::vector<int,_std::allocator<int>_>::vector(&scan_seq,__n,(allocator_type *)&local_2a8);
  std::vector<int,_std::allocator<int>_>::vector(&scan_par,__n,(allocator_type *)&local_2a8);
  auVar4 = _DAT_00111020;
  if (iVar6 != 0) {
    lVar15 = __n - 1;
    auVar13._8_4_ = (int)lVar15;
    auVar13._0_8_ = lVar15;
    auVar13._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar11 = 0;
    auVar13 = auVar13 ^ _DAT_00111020;
    auVar14 = _DAT_00111010;
    do {
      auVar16 = auVar14 ^ auVar4;
      if ((bool)(~(auVar16._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar16._0_4_ ||
                  auVar13._4_4_ < auVar16._4_4_) & 1)) {
        elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar11] = (int)uVar11;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar11 + 1] = (int)uVar11 + 1;
      }
      uVar11 = uVar11 + 2;
      lVar15 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar15 + 2;
    } while ((__n + 1 & 0xfffffffffffffffe) != uVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"sequential exclusive scan ... ",0x1e);
  std::chrono::_V2::steady_clock::now();
  if (elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar7 = elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar12 = scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    iVar5 = -1;
    do {
      iVar2 = *piVar7;
      piVar7 = piVar7 + 1;
      *piVar12 = iVar5;
      piVar12 = piVar12 + 1;
      iVar5 = iVar2 + iVar5;
    } while (piVar7 != elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::chrono::_V2::steady_clock::now();
  poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"ns\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"parallel   exclusive scan ... ",0x1e);
  std::chrono::_V2::steady_clock::now();
  local_2a8.first._M_current =
       elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_2a8.last._M_current =
       elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_2a8.d_first._M_current =
       scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_2a8.init = -1;
  local_248.repeat = 0;
  local_250 = (void *)0x0;
  local_23c = 0;
  tf::Graph::
  _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Subflow>,tf::make_exclusive_scan_task<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,std::plus<int>>(__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,std::plus<int>)::_lambda(tf::Subflow&)_1_>
            (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,&local_2c9,
             (void **)&local_248,&local_250,&local_23c,&local_2ca,&local_2a8);
  local_248.repeat = 1;
  this_00 = &executor;
  tf::Executor::
  run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
            ((Future<void> *)&local_2a8,this_00,&taskflow,&local_248,
             (anon_class_1_0_00000001 *)&local_250);
  if ((_State_baseV2 *)local_2a8.first._M_current != (_State_baseV2 *)0x0) {
    std::__future_base::_State_baseV2::wait((_State_baseV2 *)local_2a8.first._M_current,this_00);
    plVar3 = (long *)CONCAT44(local_2a8._28_4_,local_2a8.init);
    if (plVar3 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)plVar3 + 0xc);
        iVar5 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(int *)((long)plVar3 + 0xc);
        *(int *)((long)plVar3 + 0xc) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (**(code **)(*plVar3 + 0x18))();
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8.last._M_current !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8.last._M_current);
    }
    std::chrono::_V2::steady_clock::now();
    poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"ns\n",3);
    if (iVar6 != 0) {
      sVar10 = 0;
      do {
        if (scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[sVar10] !=
            scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[sVar10]) {
          printf("scan_seq[%zu]=%d..., scan_par[%zu]=%d...\n",sVar10);
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"incorrect result");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar10 = sVar10 + 1;
      } while (__n != sVar10);
    }
    puts("correct result");
    if (scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tf::Taskflow::~Taskflow(&taskflow);
    tf::Executor::~Executor(&executor);
    return 0;
  }
  uVar9 = std::__throw_future_error(3);
  if (scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)scan_par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)scan_seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tf::Taskflow::~Taskflow(&taskflow);
  tf::Executor::~Executor(&executor);
  _Unwind_Resume(uVar9);
}

Assistant:

int main(int argc, char* argv[]) {

  if(argc != 3) {
    std::cerr << "usage: ./exclusive_scan num_workers num_elements\n"; 
    std::exit(EXIT_FAILURE);
  }

  size_t W = std::atoi(argv[1]);
  size_t N = std::atoi(argv[2]);

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<int> elements(N), scan_seq(N), scan_par(N);
  for(size_t i=0; i<N; i++) {
    elements[i] = static_cast<int>(i);
  }
  
  // sequential exclusive scan
  {
    std::cout << "sequential exclusive scan ... ";
    auto beg = std::chrono::steady_clock::now();
    std::exclusive_scan(
      elements.begin(), elements.end(), scan_seq.begin(), -1, std::plus<int>{}
    );
    auto end = std::chrono::steady_clock::now();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(end-beg).count()
              << "ns\n";
  }

  // create a parallel exclusive scan task
  {
    std::cout << "parallel   exclusive scan ... ";
    auto beg = std::chrono::steady_clock::now();
    taskflow.exclusive_scan(
      elements.begin(), elements.end(), scan_par.begin(), -1, std::plus<int>{}
    );
    executor.run(taskflow).wait();
    auto end = std::chrono::steady_clock::now();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(end-beg).count()
              << "ns\n";
  }

  // verify the result
  for(size_t i=0; i<N; i++) {
    if(scan_seq[i] != scan_par[i]) {
      printf(
        "scan_seq[%zu]=%d..., scan_par[%zu]=%d...\n",
        i, scan_seq[i], i, scan_par[i]
      );
      throw std::runtime_error("incorrect result");
    }
  }

  printf("correct result\n");

  return 0;
}